

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sumofdigits.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char cVar1;
  istream *piVar2;
  long *plVar3;
  long lVar4;
  int iVar5;
  string line;
  ifstream stream;
  undefined1 *local_250;
  long local_248;
  undefined1 local_240 [16];
  long local_230 [65];
  
  std::ifstream::ifstream((istream *)local_230,argv[1],_S_in);
  local_248 = 0;
  local_240[0] = 0;
  local_250 = local_240;
  while( true ) {
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_230[0] + -0x18) + (char)(istream *)local_230
                           );
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_230,(string *)&local_250,cVar1);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    if (local_248 == 0) {
      iVar5 = 0;
    }
    else {
      lVar4 = 0;
      iVar5 = 0;
      do {
        iVar5 = iVar5 + (char)local_250[lVar4] + -0x30;
        lVar4 = lVar4 + 1;
      } while (local_248 != lVar4);
    }
    plVar3 = (long *)std::ostream::operator<<((ostream *)&std::cout,iVar5);
    std::ios::widen((char)*(undefined8 *)(*plVar3 + -0x18) + (char)plVar3);
    std::ostream::put((char)plVar3);
    std::ostream::flush();
  }
  if (local_250 != local_240) {
    operator_delete(local_250);
  }
  std::ifstream::~ifstream(local_230);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
    ifstream stream(argv[1]);

    string line;
    int sum;
    while (getline(stream, line)) {
        sum = 0;
        for(int i = 0; i < line.length(); i++){
            sum += line[i] - (int)'0';
        }
        std::cout << sum << std::endl;
    }
    return 0;
}